

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int32_t roundAndPackInt32(flag zSign,uint64_t absZ,float_status *status)

{
  ulong uVar1;
  int local_28;
  char local_23;
  int32_t z;
  int8_t roundBits;
  int8_t roundIncrement;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t absZ_local;
  flag zSign_local;
  
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    local_23 = '@';
    break;
  case '\x01':
    local_23 = '\0';
    if (zSign != '\0') {
      local_23 = '\x7f';
    }
    break;
  case '\x02':
    local_23 = '\x7f';
    if (zSign != '\0') {
      local_23 = '\0';
    }
    break;
  case '\x03':
    local_23 = '\0';
    break;
  case '\x05':
    local_23 = '\x7f';
    if ((absZ & 0x80) != 0) {
      local_23 = '\0';
    }
    break;
  default:
    abort();
  }
  uVar1 = (long)(int)((((byte)absZ & 0x7f) == 0x40 && status->float_rounding_mode == '\0') ^
                     0xffffffff) & absZ + (long)local_23 >> 7;
  local_28 = (int)uVar1;
  if (zSign != '\0') {
    local_28 = -local_28;
  }
  if ((uVar1 >> 0x20 == 0) && ((local_28 == 0 || (local_28 < 0 == (bool)zSign)))) {
    if ((absZ & 0x7f) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    absZ_local._4_4_ = local_28;
  }
  else {
    float_raise_tricore('\x01',status);
    absZ_local._4_4_ = 0x7fffffff;
    if (zSign != '\0') {
      absZ_local._4_4_ = -0x80000000;
    }
  }
  return absZ_local._4_4_;
}

Assistant:

static int32_t roundAndPackInt32(flag zSign, uint64_t absZ, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int8_t roundIncrement, roundBits;
    int32_t z;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x40;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x7f;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x7f : 0;
        break;
    case float_round_to_odd:
        roundIncrement = absZ & 0x80 ? 0 : 0x7f;
        break;
    default:
        abort();
    }
    roundBits = absZ & 0x7F;
    absZ = ( absZ + roundIncrement )>>7;
    absZ &= ~ ( ( ( roundBits ^ 0x40 ) == 0 ) & roundNearestEven );
    z = absZ;
    if ( zSign ) z = - z;
    if ( ( absZ>>32 ) || ( z && ( ( z < 0 ) ^ zSign ) ) ) {
        float_raise(float_flag_invalid, status);
        return zSign ? INT32_MIN : INT32_MAX;
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}